

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

char * bstr2cstr(const_bstring b,char z)

{
  int iVar1;
  uchar uVar2;
  char *r;
  int local_20;
  int l;
  int i;
  char z_local;
  const_bstring b_local;
  
  if (((b == (const_bstring)0x0) || (b->slen < 0)) || (b->data == (uchar *)0x0)) {
    b_local = (const_bstring)0x0;
  }
  else {
    iVar1 = b->slen;
    b_local = (const_bstring)malloc((long)iVar1 + 1);
    if (b_local != (const_bstring)0x0) {
      for (local_20 = 0; local_20 < iVar1; local_20 = local_20 + 1) {
        uVar2 = z;
        if (b->data[local_20] != '\0') {
          uVar2 = b->data[local_20];
        }
        *(uchar *)((long)&b_local->mlen + (long)local_20) = uVar2;
      }
      *(undefined1 *)((long)&b_local->mlen + (long)iVar1) = 0;
    }
  }
  return (char *)b_local;
}

Assistant:

char * bstr2cstr (const_bstring b, char z) {
int i, l;
char * r;

	if (b == NULL || b->slen < 0 || b->data == NULL) return NULL;
	l = b->slen;
	r = (char *) bstr__alloc ((size_t)l + 1);
	if (r == NULL) return r;

	for (i=0; i < l; i ++) {
		r[i] = (char) ((b->data[i] == '\0') ? z : (char) (b->data[i]));
	}

	r[l] = (unsigned char) '\0';

	return r;
}